

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall
QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate
          (QHttpNetworkRequestPrivate *this,QHttpNetworkRequestPrivate *other)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  RedirectPolicy RVar8;
  
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate
            (&this->super_QHttpNetworkHeaderPrivate,&other->super_QHttpNetworkHeaderPrivate);
  this->operation = other->operation;
  QArrayDataPointer<char>::QArrayDataPointer(&(this->customVerb).d,&(other->customVerb).d);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&(this->fullLocalServerName).d,&(other->fullLocalServerName).d);
  this->priority = other->priority;
  this->uploadByteDevice = other->uploadByteDevice;
  bVar1 = other->pipeliningAllowed;
  bVar2 = other->http2Allowed;
  bVar3 = other->http2Direct;
  bVar4 = other->h2cAllowed;
  bVar5 = other->withCredentials;
  bVar6 = other->ssl;
  bVar7 = other->preConnect;
  this->autoDecompress = other->autoDecompress;
  this->pipeliningAllowed = bVar1;
  this->http2Allowed = bVar2;
  this->http2Direct = bVar3;
  this->h2cAllowed = bVar4;
  this->withCredentials = bVar5;
  this->ssl = bVar6;
  this->preConnect = bVar7;
  this->needResendWithCredentials = other->needResendWithCredentials;
  RVar8 = other->redirectPolicy;
  this->redirectCount = other->redirectCount;
  this->redirectPolicy = RVar8;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&(this->peerVerifyName).d,&(other->peerVerifyName).d);
  return;
}

Assistant:

QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(const QHttpNetworkRequestPrivate &other) // = default
    : QHttpNetworkHeaderPrivate(other),
      operation(other.operation),
      customVerb(other.customVerb),
      fullLocalServerName(other.fullLocalServerName),
      priority(other.priority),
      uploadByteDevice(other.uploadByteDevice),
      autoDecompress(other.autoDecompress),
      pipeliningAllowed(other.pipeliningAllowed),
      http2Allowed(other.http2Allowed),
      http2Direct(other.http2Direct),
      h2cAllowed(other.h2cAllowed),
      withCredentials(other.withCredentials),
      ssl(other.ssl),
      preConnect(other.preConnect),
      needResendWithCredentials(other.needResendWithCredentials),
      redirectCount(other.redirectCount),
      redirectPolicy(other.redirectPolicy),
      peerVerifyName(other.peerVerifyName)
{
}